

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O2

int unix_madvise(void *addr,size_t size,int advice)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = madvise(addr,size,advice);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
  }
  return iVar1;
}

Assistant:

static int unix_madvise(void* addr, size_t size, int advice) {
  #if defined(__sun)
  int res = madvise((caddr_t)addr, size, advice);  // Solaris needs cast (issue #520)
  #elif defined(__QNX__)
  int res = posix_madvise(addr, size, advice);
  #else
  int res = madvise(addr, size, advice);
  #endif
  return (res==0 ? 0 : errno);
}